

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ViconCGStreamBayer.cpp
# Opt level: O3

void VViconCGStreamBayer::BayerRGToBGR
               (uint i_Width,uint i_Height,uchar *i_pBayerData,uchar *o_pBGRData)

{
  byte *pbVar1;
  byte *pbVar2;
  uint uVar3;
  uint uVar4;
  byte *pbVar5;
  
  if ((i_Width & 1) != 0) {
    __assert_fail("( i_Width % 2 ) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/whoenig[P]vicon-datastream-sdk/Vicon/CrossMarket/DataStream/ViconCGStreamClient/ViconCGStreamBayer.cpp"
                  ,0xbd,
                  "static void VViconCGStreamBayer::BayerRGToBGR(unsigned int, unsigned int, const unsigned char *, unsigned char *)"
                 );
  }
  if ((i_Height & 1) != 0) {
    __assert_fail("( i_Height % 2 ) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/whoenig[P]vicon-datastream-sdk/Vicon/CrossMarket/DataStream/ViconCGStreamClient/ViconCGStreamBayer.cpp"
                  ,0xbe,
                  "static void VViconCGStreamBayer::BayerRGToBGR(unsigned int, unsigned int, const unsigned char *, unsigned char *)"
                 );
  }
  memset(o_pBGRData,0,(ulong)(i_Width * 3));
  if (1 < i_Height) {
    pbVar5 = o_pBGRData + i_Width * 3;
    pbVar2 = i_pBayerData + i_Width;
    uVar3 = 1;
    do {
      if ((uVar3 & 1) == 0) {
        if (1 < i_Width) {
          uVar4 = 1;
          do {
            *pbVar5 = pbVar2[1];
            pbVar5[1] = (byte)((uint)*pbVar2 + (uint)i_pBayerData[1] >> 1);
            pbVar5[2] = *i_pBayerData;
            pbVar5[3] = pbVar2[1];
            pbVar1 = pbVar2 + 2;
            pbVar2 = pbVar2 + 2;
            pbVar5[4] = (byte)((uint)*pbVar1 + (uint)i_pBayerData[1] >> 1);
            pbVar1 = i_pBayerData + 2;
            i_pBayerData = i_pBayerData + 2;
            pbVar5[5] = *pbVar1;
            pbVar5 = pbVar5 + 6;
            uVar4 = uVar4 + 2;
          } while (uVar4 < i_Width);
        }
      }
      else if (1 < i_Width) {
        uVar4 = 1;
        do {
          *pbVar5 = i_pBayerData[1];
          pbVar5[1] = (byte)((uint)*i_pBayerData + (uint)pbVar2[1] >> 1);
          pbVar5[2] = *pbVar2;
          pbVar5[3] = i_pBayerData[1];
          pbVar1 = i_pBayerData + 2;
          i_pBayerData = i_pBayerData + 2;
          pbVar5[4] = (byte)((uint)*pbVar1 + (uint)pbVar2[1] >> 1);
          pbVar1 = pbVar2 + 2;
          pbVar2 = pbVar2 + 2;
          pbVar5[5] = *pbVar1;
          pbVar5 = pbVar5 + 6;
          uVar4 = uVar4 + 2;
        } while (uVar4 < i_Width);
      }
      pbVar5[-1] = 0;
      pbVar5[-3] = 0;
      pbVar5[-2] = 0;
      uVar3 = uVar3 + 1;
    } while (uVar3 != i_Height);
  }
  return;
}

Assistant:

void VViconCGStreamBayer::BayerRGToBGR( unsigned int i_Width, unsigned int i_Height, const unsigned char * i_pBayerData, unsigned char * o_pBGRData )
{
  assert( ( i_Width  % 2 ) == 0 );
  assert( ( i_Height % 2 ) == 0 );

  std::memset( o_pBGRData, 0, i_Width * 3 );

  const unsigned char * pLineAbove = i_pBayerData;
  const unsigned char * pLine = i_pBayerData + i_Width;
  unsigned char * pBGR = o_pBGRData + i_Width * 3;

  for( unsigned int Y = 1; Y < i_Height; Y++ )
  {
    if( ( Y & 1 ) == 0 )
    {
      for( unsigned int X = 0; ( X + 1 ) < i_Width; X += 2 )
      {
        // Second line (odd lines): green, blue
        pBGR[ 0 ] = pLine[ 1 ];
        pBGR[ 1 ] = ( pLineAbove[ 1 ] + pLine[ 0 ] ) / 2;
        pBGR[ 2 ] = pLineAbove[ 0 ];

        pLine++;
        pLineAbove++;
        pBGR += 3;

        pBGR[ 0 ] = pLine[ 0 ];
        pBGR[ 1 ] = ( pLineAbove[ 0 ] + pLine[ 1 ] ) / 2;
        pBGR[ 2 ] = pLineAbove[ 1 ];

        pLine++;
        pLineAbove++;
        pBGR += 3;
      }
    }
    else
    {
      for( unsigned int X = 0; ( X + 1 ) < i_Width; X += 2 )
      {
        // First line (odd lines): red, green
        pBGR[ 0 ] = pLineAbove[ 1 ];
        pBGR[ 1 ] = ( pLine[ 1 ] + pLineAbove[ 0 ] ) / 2;
        pBGR[ 2 ] = pLine[ 0 ];

        pLine++;
        pLineAbove++;
        pBGR += 3;

        pBGR[ 0 ] = pLineAbove[ 0 ];
        pBGR[ 1 ] = ( pLine[ 0 ] + pLineAbove[ 1 ] ) / 2;
        pBGR[ 2 ] = pLine[ 1 ];

        pLine++;
        pLineAbove++;
        pBGR += 3;
      }
    }

    // Clear right-hand edge.
    *( pBGR - 1 ) = 0;
    *( pBGR - 2 ) = 0;
    *( pBGR - 3 ) = 0;
  }
}